

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

Type flexbuffers::ToTypedVector(Type t,size_t fixed_len)

{
  uint __line;
  char *__assertion;
  
  if ((t < (FBT_BOOL|FBT_INT)) &&
     ((0x400003eU >> (t & (FBT_VECTOR_FLOAT4|FBT_INDIRECT_UINT)) & 1) != 0)) {
    if ((fixed_len < 5) && ((0x1dU >> ((uint)fixed_len & 0x1f) & 1) != 0)) {
      return t + *(int *)(&DAT_0013f35c + fixed_len * 4);
    }
    __assertion = "0";
    __line = 0x6f;
  }
  else {
    __assertion = "IsTypedVectorElementType(t)";
    __line = 0x69;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                ,__line,"Type flexbuffers::ToTypedVector(Type, size_t)");
}

Assistant:

inline Type ToTypedVector(Type t, size_t fixed_len = 0) {
  FLATBUFFERS_ASSERT(IsTypedVectorElementType(t));
  switch (fixed_len) {
    case 0: return static_cast<Type>(t - FBT_INT + FBT_VECTOR_INT);
    case 2: return static_cast<Type>(t - FBT_INT + FBT_VECTOR_INT2);
    case 3: return static_cast<Type>(t - FBT_INT + FBT_VECTOR_INT3);
    case 4: return static_cast<Type>(t - FBT_INT + FBT_VECTOR_INT4);
    default: FLATBUFFERS_ASSERT(0); return FBT_NULL;
  }
}